

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool CheckTag(HSQUIRRELVM v,SQREADFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)

{
  bool bVar1;
  SQUnsignedInteger32 t;
  
  bVar1 = SafeRead(v,read,up,&t,4);
  if (bVar1) {
    bVar1 = true;
    if (t != tag) {
      bVar1 = false;
      SQVM::Raise_Error(v,"invalid or corrupted closure stream");
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckTag(HSQUIRRELVM v,SQREADFUNC read,SQUserPointer up,SQUnsignedInteger32 tag)
{
    SQUnsignedInteger32 t;
    _CHECK_IO(SafeRead(v,read,up,&t,sizeof(t)));
    if(t != tag){
        v->Raise_Error(_SC("invalid or corrupted closure stream"));
        return false;
    }
    return true;
}